

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall
diy::Master::foreach<void(Block<float>::*)(diy::Master::ProxyWithLink_const&)>
          (Master *this,offset_in_Block<float>_to_subr *f,Skip *s)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  if ((void *)*f != (void *)0x0) {
    local_28._8_8_ = f[1];
    pcStack_10 = std::
                 _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_void_(Block<float>::*)(const_diy::Master::ProxyWithLink_&)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_void_(Block<float>::*)(const_diy::Master::ProxyWithLink_&)>
               ::_M_manager;
    local_28._M_unused._M_object = (void *)*f;
  }
  foreach_<Block<float>>(this,(Callback<Block<float>_> *)&local_28,s);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

int           gid(int i) const                    { return gids_[i]; }